

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O2

void color_quantize3(j_decompress_ptr cinfo,JSAMPARRAY input_buf,JSAMPARRAY output_buf,int num_rows)

{
  JDIMENSION JVar1;
  _func_void_j_decompress_ptr *p_Var2;
  long lVar3;
  long lVar4;
  long lVar5;
  JSAMPROW pJVar6;
  ulong uVar7;
  ulong uVar8;
  byte *pbVar9;
  long lVar10;
  
  p_Var2 = cinfo->cquantize[1].finish_pass;
  lVar3 = *(long *)p_Var2;
  lVar4 = *(long *)(p_Var2 + 8);
  lVar5 = *(long *)(p_Var2 + 0x10);
  JVar1 = cinfo->output_width;
  uVar8 = 0;
  uVar7 = (ulong)(uint)num_rows;
  if (num_rows < 1) {
    uVar7 = uVar8;
  }
  for (; uVar8 != uVar7; uVar8 = uVar8 + 1) {
    pbVar9 = input_buf[uVar8];
    pJVar6 = output_buf[uVar8];
    for (lVar10 = 0; JVar1 != (JDIMENSION)lVar10; lVar10 = lVar10 + 1) {
      pJVar6[lVar10] =
           *(char *)(lVar4 + (ulong)pbVar9[1]) + *(char *)(lVar3 + (ulong)*pbVar9) +
           *(char *)(lVar5 + (ulong)pbVar9[2]);
      pbVar9 = pbVar9 + 3;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
color_quantize3(j_decompress_ptr cinfo, JSAMPARRAY input_buf,
                JSAMPARRAY output_buf, int num_rows)
/* Fast path for out_color_components==3, no dithering */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  register int pixcode;
  register JSAMPROW ptrin, ptrout;
  JSAMPROW colorindex0 = cquantize->colorindex[0];
  JSAMPROW colorindex1 = cquantize->colorindex[1];
  JSAMPROW colorindex2 = cquantize->colorindex[2];
  int row;
  JDIMENSION col;
  JDIMENSION width = cinfo->output_width;

  for (row = 0; row < num_rows; row++) {
    ptrin = input_buf[row];
    ptrout = output_buf[row];
    for (col = width; col > 0; col--) {
      pixcode  = colorindex0[*ptrin++];
      pixcode += colorindex1[*ptrin++];
      pixcode += colorindex2[*ptrin++];
      *ptrout++ = (JSAMPLE)pixcode;
    }
  }
}